

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch_improve_lantern_handling.hpp
# Opt level: O2

uint32_t PatchImproveLanternHandling::inject_func_and_words(ROM *rom)

{
  uint32_t uVar1;
  initializer_list<md::DataRegister> __l;
  initializer_list<md::DataRegister> __l_00;
  allocator_type local_f9;
  AddressInRegister ret;
  _Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_> local_d8;
  DataRegister local_b8;
  Code func;
  
  func._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &func._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header;
  func._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  func._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  func._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  func._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  func._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  func._pending_branches._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  func._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &func._labels._M_t._M_impl.super__Rb_tree_header._M_header;
  func._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  func._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  func._labels._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_b8.super_Register._code = '\x02';
  local_b8.super_Register.super_Param._vptr_Param = (_func_int **)&PTR_getXn_00246bf0;
  __l._M_len = 1;
  __l._M_array = &local_b8;
  func._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       func._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  func._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       func._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::vector<md::DataRegister,_std::allocator<md::DataRegister>_>::vector
            ((vector<md::DataRegister,_std::allocator<md::DataRegister>_> *)&ret,__l,&local_f9);
  local_d8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_d8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  md::Code::movem_to_stack
            (&func,(vector<md::DataRegister,_std::allocator<md::DataRegister>_> *)&ret,
             (vector<md::AddressRegister,_std::allocator<md::AddressRegister>_> *)&local_d8);
  std::_Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>::~_Vector_base
            (&local_d8);
  std::_Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>::~_Vector_base
            ((_Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_> *)&ret);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ret,"loop",(allocator<char> *)&local_d8);
  md::Code::label(&func,(string *)&ret);
  std::__cxx11::string::~string((string *)&ret);
  ret.super_Param._vptr_Param = (_func_int **)&PTR_getXn_00246d28;
  ret._reg.super_Register._code = '\0';
  ret._reg.super_Register.super_Param._vptr_Param = (_func_int **)&PTR_getXn_00246c60;
  ret._offset = 0;
  ret._m_without_offset = '\x02';
  local_d8._M_impl.super__Vector_impl_data._M_finish._0_1_ = 2;
  local_d8._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR_getXn_00246bf0;
  md::Code::movew(&func,&ret.super_Param,(Param *)&local_d8);
  ret._reg.super_Register.super_Param._vptr_Param =
       ret._reg.super_Register.super_Param._vptr_Param & 0xffffffffffffff00;
  ret.super_Param._vptr_Param = (_func_int **)&PTR_getXn_00246bf0;
  local_d8._M_impl.super__Vector_impl_data._M_finish._0_1_ = 2;
  local_d8._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR_getXn_00246bf0;
  md::Code::andw(&func,&ret.super_Param,(DataRegister *)&local_d8);
  local_d8._M_impl.super__Vector_impl_data._M_finish._0_1_ = 2;
  local_d8._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR_getXn_00246bf0;
  ret.super_Param._vptr_Param = (_func_int **)&PTR_getXn_00246d28;
  ret._reg.super_Register._code = '\0';
  ret._reg.super_Register.super_Param._vptr_Param = (_func_int **)&PTR_getXn_00246c60;
  ret._offset = 0;
  ret._m_without_offset = '\x03';
  md::Code::movew(&func,(Param *)&local_d8,&ret.super_Param);
  local_d8._M_impl.super__Vector_impl_data._M_finish =
       (pointer)CONCAT71(local_d8._M_impl.super__Vector_impl_data._M_finish._1_7_,1);
  local_d8._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR_getXn_00246bf0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ret,"loop",(allocator<char> *)&local_b8);
  md::Code::dbra(&func,(DataRegister *)&local_d8,(string *)&ret);
  std::__cxx11::string::~string((string *)&ret);
  local_b8.super_Register._code = '\x02';
  local_b8.super_Register.super_Param._vptr_Param = (_func_int **)&PTR_getXn_00246bf0;
  __l_00._M_len = 1;
  __l_00._M_array = &local_b8;
  std::vector<md::DataRegister,_std::allocator<md::DataRegister>_>::vector
            ((vector<md::DataRegister,_std::allocator<md::DataRegister>_> *)&ret,__l_00,&local_f9);
  local_d8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_d8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  md::Code::movem_from_stack
            (&func,(vector<md::DataRegister,_std::allocator<md::DataRegister>_> *)&ret,
             (vector<md::AddressRegister,_std::allocator<md::AddressRegister>_> *)&local_d8);
  std::_Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>::~_Vector_base
            (&local_d8);
  std::_Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>::~_Vector_base
            ((_Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_> *)&ret);
  md::Code::rts(&func);
  std::__cxx11::string::string<std::allocator<char>>((string *)&ret,"",(allocator<char> *)&local_d8)
  ;
  uVar1 = md::ROM::inject_code(rom,&func,(string *)&ret);
  std::__cxx11::string::~string((string *)&ret);
  md::Code::~Code(&func);
  return uVar1;
}

Assistant:

static uint32_t inject_func_and_words(md::ROM& rom)
    {
        md::Code func;
        func.movem_to_stack({ reg_D2 }, {});
        {
            func.label("loop");
            {
                func.movew(addr_(reg_A0), reg_D2);
                func.andw(reg_D0, reg_D2);
                func.movew(reg_D2, addr_postinc_(reg_A0));
            }
            func.dbra(reg_D1, "loop");
        }
        func.movem_from_stack({ reg_D2 }, {});
        func.rts();
        return rom.inject_code(func);
    }